

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O3

string * adios2::helper::GetFQDN_abi_cxx11_(void)

{
  addrinfo **ppaVar1;
  char *__s;
  int iVar2;
  char *pcVar3;
  string *in_RDI;
  addrinfo *paVar4;
  addrinfo *info;
  char hostname [1024];
  addrinfo *local_460;
  addrinfo local_458;
  char local_428 [1023];
  undefined1 local_29;
  
  local_29 = 0;
  gethostname(local_428,0x3ff);
  local_458.ai_addrlen = 0;
  local_458._20_4_ = 0;
  local_458.ai_addr = (sockaddr *)0x0;
  local_458.ai_canonname = (char *)0x0;
  local_458.ai_next = (addrinfo *)0x0;
  local_458.ai_socktype = 1;
  local_458.ai_protocol = 0;
  local_458.ai_flags = 2;
  local_458.ai_family = 0;
  iVar2 = getaddrinfo(local_428,(char *)0x0,&local_458,&local_460);
  if (iVar2 == 0) {
    paVar4 = local_460;
    if (local_460 == (addrinfo *)0x0) {
      local_460 = (addrinfo *)0x0;
    }
    else {
      do {
        __s = paVar4->ai_canonname;
        pcVar3 = strchr(__s,0x2e);
        if (pcVar3 != (char *)0x0) {
          strncpy(local_428,__s,0x3ff);
          break;
        }
        ppaVar1 = &paVar4->ai_next;
        paVar4 = *ppaVar1;
      } while (*ppaVar1 != (addrinfo *)0x0);
    }
  }
  else {
    builtin_strncpy(local_428,"Unknown_Host_Name",0x12);
  }
  freeaddrinfo(local_460);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_428);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string GetFQDN() noexcept
{
    char hostname[1024];
#ifdef WIN32
    TCHAR infoBuf[1024];
    DWORD bufCharCount = sizeof(hostname);
    memset(hostname, 0, sizeof(hostname));
    if (GetComputerName(infoBuf, &bufCharCount))
    {
        int i;
        for (i = 0; i < sizeof(hostname); i++)
        {
            hostname[i] = infoBuf[i];
        }
    }
    else
    {
        strcpy(hostname, "Unknown_Host_Name");
    }
#else
    struct addrinfo hints, *info, *p;

    hostname[1023] = '\0';
    gethostname(hostname, 1023);

    memset(&hints, 0, sizeof hints);
    hints.ai_family = AF_UNSPEC; /*either IPV4 or IPV6*/
    hints.ai_socktype = SOCK_STREAM;
    hints.ai_flags = AI_CANONNAME;

    if (getaddrinfo(hostname, NULL, &hints, &info) == 0)
    {
        for (p = info; p != NULL; p = p->ai_next)
        {
            // printf("hostname: %s\n", p->ai_canonname);
            if (strchr(p->ai_canonname, '.') != NULL)
            {
                strncpy(hostname, p->ai_canonname, sizeof(hostname) - 1);
                break;
            }
        }
    }
    else
    {
        strcpy(hostname, "Unknown_Host_Name");
    }
    freeaddrinfo(info);
#endif
    return std::string(hostname);
}